

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Pgno finalDbSize(BtShared *pBt,Pgno nOrig,Pgno nFree)

{
  uint uVar1;
  Pgno PVar2;
  int in_EDX;
  uint in_ESI;
  BtShared *in_RDI;
  bool bVar3;
  Pgno nFin;
  Pgno nPtrmap;
  int nEntry;
  Pgno local_1c;
  
  uVar1 = in_RDI->usableSize / 5;
  PVar2 = ptrmapPageno(in_RDI,in_ESI);
  local_1c = (in_ESI - in_EDX) - ((in_EDX - in_ESI) + PVar2 + uVar1) / uVar1;
  if (((uint)sqlite3PendingByte / in_RDI->pageSize + 1 < in_ESI) &&
     (local_1c < (uint)sqlite3PendingByte / in_RDI->pageSize + 1)) {
    local_1c = local_1c - 1;
  }
  while( true ) {
    PVar2 = ptrmapPageno(in_RDI,local_1c);
    bVar3 = true;
    if (PVar2 != local_1c) {
      bVar3 = local_1c == (uint)sqlite3PendingByte / in_RDI->pageSize + 1;
    }
    if (!bVar3) break;
    local_1c = local_1c - 1;
  }
  return local_1c;
}

Assistant:

static Pgno finalDbSize(BtShared *pBt, Pgno nOrig, Pgno nFree){
  int nEntry;                     /* Number of entries on one ptrmap page */
  Pgno nPtrmap;                   /* Number of PtrMap pages to be freed */
  Pgno nFin;                      /* Return value */

  nEntry = pBt->usableSize/5;
  nPtrmap = (nFree-nOrig+PTRMAP_PAGENO(pBt, nOrig)+nEntry)/nEntry;
  nFin = nOrig - nFree - nPtrmap;
  if( nOrig>PENDING_BYTE_PAGE(pBt) && nFin<PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }
  while( PTRMAP_ISPAGE(pBt, nFin) || nFin==PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }

  return nFin;
}